

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O3

bool __thiscall sf::Window::setActive(Window *this,bool active)

{
  bool bVar1;
  ostream *poVar2;
  
  if (this->m_context != (GlContext *)0x0) {
    bVar1 = priv::GlContext::setActive(this->m_context,active);
    if (!bVar1) {
      poVar2 = err();
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,"Failed to activate the window\'s context",0x27);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Window::setActive(bool active) const
{
    if (m_context)
    {
        if (m_context->setActive(active))
        {
            return true;
        }
        else
        {
            err() << "Failed to activate the window's context" << std::endl;
            return false;
        }
    }
    else
    {
        return false;
    }
}